

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

size_t read_features(vw *all,char **line,size_t *num_chars)

{
  size_t sVar1;
  ulong *in_RDX;
  long *in_RSI;
  size_t num_chars_initial;
  char in_stack_0000002f;
  char **in_stack_00000030;
  io_buf *in_stack_00000038;
  
  *in_RSI = 0;
  sVar1 = readto(in_stack_00000038,in_stack_00000030,in_stack_0000002f);
  if (sVar1 != 0) {
    *in_RDX = sVar1;
    if ((((*(char *)*in_RSI == -0x11) && (2 < *in_RDX)) && (*(char *)(*in_RSI + 1) == -0x45)) &&
       (*(char *)(*in_RSI + 2) == -0x41)) {
      *in_RSI = *in_RSI + 3;
      *in_RDX = *in_RDX - 3;
    }
    if ((*in_RDX != 0) && (*(char *)(*in_RSI + (*in_RDX - 1)) == '\n')) {
      *in_RDX = *in_RDX - 1;
    }
    if ((*in_RDX != 0) && (*(char *)(*in_RSI + (*in_RDX - 1)) == '\r')) {
      *in_RDX = *in_RDX - 1;
    }
  }
  return sVar1;
}

Assistant:

size_t read_features(vw* all, char*& line, size_t& num_chars)
{
  line = nullptr;
  size_t num_chars_initial = readto(*(all->p->input), line, '\n');
  if (num_chars_initial < 1)
    return num_chars_initial;
  num_chars = num_chars_initial;
  if (line[0] == '\xef' && num_chars >= 3 && line[1] == '\xbb' && line[2] == '\xbf')
  {
    line += 3;
    num_chars -= 3;
  }
  if (num_chars > 0 && line[num_chars - 1] == '\n')
    num_chars--;
  if (num_chars > 0 && line[num_chars - 1] == '\r')
    num_chars--;
  return num_chars_initial;
}